

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall RPCArg::GetFirstName_abi_cxx11_(string *__return_storage_ptr__,RPCArg *this)

{
  long lVar1;
  size_type __n;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                  (&this->m_names,'|',0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,&this->m_names,0,__n);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string RPCArg::GetFirstName() const
{
    return m_names.substr(0, m_names.find('|'));
}